

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O2

void __thiscall
GlobOpt::UpdateIntBoundsForGreaterThanOrEqualBranch(GlobOpt *this,Value *src1Value,Value *src2Value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int32 local_48;
  int32 iStack_44;
  IntConstantBounds src1ConstantBounds;
  IntConstantBounds local_30;
  IntConstantBounds src2ConstantBounds;
  
  if (src1Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x10c,"(src1Value)","src1Value");
    if (!bVar2) goto LAB_004714f4;
    *puVar3 = 0;
  }
  if (src2Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x10d,"(src2Value)","src2Value");
    if (!bVar2) goto LAB_004714f4;
    *puVar3 = 0;
  }
  bVar2 = DoPathDependentValues(this);
  if ((bVar2) && (src1Value->valueNumber != src2Value->valueNumber)) {
    if (this->prePassLoop == (Loop *)0x0) {
      bVar2 = DoAggressiveIntTypeSpec(this);
      if (bVar2) {
        bVar2 = DoConstFold(this);
        if (bVar2) {
          local_48 = 0;
          iStack_44 = 0;
          local_30.lowerBound = 0;
          local_30.upperBound = 0;
          bVar2 = ValueInfo::TryGetIntConstantBounds
                            (src1Value->valueInfo,(IntConstantBounds *)&stack0xffffffffffffffb8,true
                            );
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                               ,0x118,
                               "(src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true))"
                               ,
                               "src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true)"
                              );
            if (!bVar2) goto LAB_004714f4;
            *puVar3 = 0;
          }
          bVar2 = ValueInfo::TryGetIntConstantBounds(src2Value->valueInfo,&local_30,true);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                               ,0x119,
                               "(src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true))"
                               ,
                               "src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true)"
                              );
            if (!bVar2) goto LAB_004714f4;
            *puVar3 = 0;
          }
          bVar2 = ValueInfo::IsGreaterThanOrEqualTo
                            (src1Value,local_48,iStack_44,src2Value,local_30.lowerBound,
                             local_30.upperBound);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                               ,0x122,
                               "(!ValueInfo::IsGreaterThanOrEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound()))"
                               ,
                               "!ValueInfo::IsGreaterThanOrEqualTo( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound())"
                              );
            if (!bVar2) goto LAB_004714f4;
            *puVar3 = 0;
          }
          bVar2 = ValueInfo::IsLessThan
                            (src1Value,local_48,iStack_44,src2Value,local_30.lowerBound,
                             local_30.upperBound);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                               ,0x12a,
                               "(!ValueInfo::IsLessThan( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound()))"
                               ,
                               "!ValueInfo::IsLessThan( src1Value, src1ConstantBounds.LowerBound(), src1ConstantBounds.UpperBound(), src2Value, src2ConstantBounds.LowerBound(), src2ConstantBounds.UpperBound())"
                              );
            if (!bVar2) {
LAB_004714f4:
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar3 = 0;
          }
        }
      }
    }
    _local_48 = (IntConstantBounds)src1Value;
    src1ConstantBounds = (IntConstantBounds)src2Value;
    SetPathDependentInfo(this,true,(PathDependentInfo *)&stack0xffffffffffffffb8);
    _local_48 = (IntConstantBounds)src1Value;
    src1ConstantBounds = (IntConstantBounds)src2Value;
    SetPathDependentInfo(this,false,(PathDependentInfo *)&stack0xffffffffffffffb8);
  }
  return;
}

Assistant:

void GlobOpt::UpdateIntBoundsForGreaterThanOrEqualBranch(Value *const src1Value, Value *const src2Value)
{
    Assert(src1Value);
    Assert(src2Value);

    if(!DoPathDependentValues() || src1Value->GetValueNumber() == src2Value->GetValueNumber())
    {
        return;
    }

#if DBG
    if(!IsLoopPrePass() && DoAggressiveIntTypeSpec() && DoConstFold())
    {
        IntConstantBounds src1ConstantBounds, src2ConstantBounds;
        AssertVerify(src1Value->GetValueInfo()->TryGetIntConstantBounds(&src1ConstantBounds, true));
        AssertVerify(src2Value->GetValueInfo()->TryGetIntConstantBounds(&src2ConstantBounds, true));

        Assert(
            !ValueInfo::IsGreaterThanOrEqualTo(
                src1Value,
                src1ConstantBounds.LowerBound(),
                src1ConstantBounds.UpperBound(),
                src2Value,
                src2ConstantBounds.LowerBound(),
                src2ConstantBounds.UpperBound()));
        Assert(
            !ValueInfo::IsLessThan(
                src1Value,
                src1ConstantBounds.LowerBound(),
                src1ConstantBounds.UpperBound(),
                src2Value,
                src2ConstantBounds.LowerBound(),
                src2ConstantBounds.UpperBound()));
    }
#endif

    SetPathDependentInfo(true, PathDependentInfo(PathDependentRelationship::GreaterThanOrEqual, src1Value, src2Value));
    SetPathDependentInfo(false, PathDependentInfo(PathDependentRelationship::LessThan, src1Value, src2Value));
}